

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTBITDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  octet **in_RCX;
  long *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  size_t l;
  octet *v;
  undefined4 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  byte *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  size_t local_8;
  
  local_8 = derDec2(in_RCX,(size_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else if (((in_stack_ffffffffffffffc0 == (void *)0x0) || (7 < *in_stack_ffffffffffffffc8)) ||
          ((*in_stack_ffffffffffffffc8 != 0 && (in_stack_ffffffffffffffc0 == (void *)0x1)))) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_RDI != 0) {
      memMove(in_stack_ffffffffffffffc0,
              (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0x12447f);
    }
    if (in_RSI != (long *)0x0) {
      *in_RSI = ((long)in_stack_ffffffffffffffc0 + -1) * 8 - (ulong)*in_stack_ffffffffffffffc8;
    }
  }
  return local_8;
}

Assistant:

size_t derTBITDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1) 
		return SIZE_MAX;
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l - 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - 1));
		memMove(val, v + 1, l - 1);
	}
	// возвратить битовую длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = (l - 1) * 8 - v[0];
	}
	return count;
}